

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_highbd_dr_prediction_z2_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  undefined4 uVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  short sVar17;
  int iVar18;
  int min_base_x;
  int iVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 in_ZMM4 [64];
  ushort uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  int local_7c;
  int frac_bits_x_2;
  int frac_bits_x;
  int min_base_x_1;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  
  auVar31._0_2_ = (undefined2)dy;
  bVar7 = (byte)upsample_above;
  local_7c = bh;
  if (bw == 8) {
    iVar19 = -1 << (bVar7 & 0x1f);
    iVar4 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      if (0 < bh) {
        auVar49._0_2_ = (undefined2)iVar4;
        auVar49._2_2_ = auVar49._0_2_;
        auVar49._4_2_ = auVar49._0_2_;
        auVar49._6_2_ = auVar49._0_2_;
        auVar49._8_2_ = auVar49._0_2_;
        auVar49._10_2_ = auVar49._0_2_;
        auVar49._12_2_ = auVar49._0_2_;
        auVar49._14_2_ = auVar49._0_2_;
        auVar28._2_2_ = auVar31._0_2_;
        auVar28._0_2_ = auVar31._0_2_;
        auVar28._4_2_ = auVar31._0_2_;
        auVar28._6_2_ = auVar31._0_2_;
        auVar28._8_2_ = auVar31._0_2_;
        auVar28._10_2_ = auVar31._0_2_;
        auVar28._12_2_ = auVar31._0_2_;
        auVar28._14_2_ = auVar31._0_2_;
        auVar28 = vpmullw_avx(auVar28,_DAT_00514ef0);
        auVar31 = vpsrlw_avx(auVar28,1);
        auVar31 = vpand_avx(auVar31,_DAT_00514f00);
        uVar9 = -dx;
        auVar39._8_8_ = 0x1f001f001f001f;
        auVar39._0_8_ = 0x1f001f001f001f;
        auVar67._8_2_ = 0x10;
        auVar67._0_8_ = 0x10001000100010;
        auVar67._10_2_ = 0x10;
        auVar67._12_2_ = 0x10;
        auVar67._14_2_ = 0x10;
        auVar67._16_2_ = 0x10;
        auVar67._18_2_ = 0x10;
        auVar67._20_2_ = 0x10;
        auVar67._22_2_ = 0x10;
        auVar67._24_2_ = 0x10;
        auVar67._26_2_ = 0x10;
        auVar67._28_2_ = 0x10;
        auVar67._30_2_ = 0x10;
        sVar17 = 0;
        auVar97[8] = 0xf;
        auVar97._0_8_ = 0xf0f0f0f0f0f0f0f;
        auVar97[9] = 0xf;
        auVar97[10] = 0xf;
        auVar97[0xb] = 0xf;
        auVar97[0xc] = 0xf;
        auVar97[0xd] = 0xf;
        auVar97[0xe] = 0xf;
        auVar97[0xf] = 0xf;
        iVar4 = dx;
        do {
          uVar12 = (int)uVar9 >> (6 - bVar7 & 0x1f);
          iVar18 = (int)(~uVar12 + iVar19) >> (bVar7 & 0x1f);
          if (iVar19 + -1 <= (int)uVar12) {
            iVar18 = 0;
          }
          uVar21 = (int)((iVar19 + upsample_above) - uVar12) >> (bVar7 & 0x1f);
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if (7 < (int)uVar21) {
            uVar21 = 8;
          }
          auVar68 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar85 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar76 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (iVar18 < 8) {
            lVar10 = (long)iVar18;
            auVar83 = *(undefined1 (*) [16])(above + (int)uVar12 + lVar10);
            auVar62._0_2_ = (undefined2)iVar4;
            if (upsample_above == 0) {
              auVar83 = vpshufb_avx(auVar83,(undefined1  [16])HighbdLoadMaskx[lVar10]);
              auVar73 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 1),
                                    (undefined1  [16])HighbdLoadMaskx[lVar10]);
              auVar63._2_2_ = auVar62._0_2_;
              auVar63._0_2_ = auVar62._0_2_;
              auVar63._4_2_ = auVar62._0_2_;
              auVar63._6_2_ = auVar62._0_2_;
              auVar63._8_2_ = auVar62._0_2_;
              auVar63._10_2_ = auVar62._0_2_;
              auVar63._12_2_ = auVar62._0_2_;
              auVar63._14_2_ = auVar62._0_2_;
              auVar62 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar63);
              auVar64 = vpinsrw_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
              auVar64 = vpinsrw_avx(auVar64,uVar9 + 0x80,2);
              auVar64 = vpinsrw_avx(auVar64,uVar9 + 0xc0,3);
              auVar64 = vpunpcklqdq_avx(auVar64,auVar62);
            }
            else {
              auVar73 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar10];
              auVar64 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar10] + 0x10);
              auVar63 = vpshufb_avx(auVar83,auVar73);
              auVar93 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 8),
                                    auVar73);
              auVar25 = vpshufb_avx(auVar83,auVar64);
              auVar23 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 8),
                                    auVar64);
              auVar83 = vpcmpgtb_avx(auVar73,auVar97);
              auVar83 = vpblendvb_avx(auVar63,auVar93,auVar83);
              auVar73 = vpcmpgtb_avx(auVar64,auVar97);
              auVar73 = vpblendvb_avx(auVar25,auVar23,auVar73);
              auVar62._2_2_ = auVar62._0_2_;
              auVar62._4_2_ = auVar62._0_2_;
              auVar62._6_2_ = auVar62._0_2_;
              auVar62._8_2_ = auVar62._0_2_;
              auVar62._10_2_ = auVar62._0_2_;
              auVar62._12_2_ = auVar62._0_2_;
              auVar62._14_2_ = auVar62._0_2_;
              auVar62 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar62);
              auVar64 = vpinsrw_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
              auVar64 = vpinsrw_avx(auVar64,uVar9 + 0x80,2);
              auVar64 = vpinsrw_avx(auVar64,uVar9 + 0xc0,3);
              auVar64 = vpunpcklqdq_avx(auVar64,auVar62);
              auVar64 = vpsllw_avx(auVar64,ZEXT416((uint)upsample_above));
            }
            auVar64 = vpsrlw_avx(auVar64,1);
            auVar64 = vpand_avx(auVar64,auVar39);
            auVar68._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar64;
            auVar68._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
            auVar76._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar83;
            auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
            auVar85._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar73;
            auVar85._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
          }
          auVar86 = auVar85;
          auVar69 = auVar68;
          auVar77 = auVar76;
          if ((int)uVar12 < iVar19) {
            auVar93._2_2_ = sVar17;
            auVar93._0_2_ = sVar17;
            auVar93._4_2_ = sVar17;
            auVar93._6_2_ = sVar17;
            auVar93._8_2_ = sVar17;
            auVar93._10_2_ = sVar17;
            auVar93._12_2_ = sVar17;
            auVar93._14_2_ = sVar17;
            auVar83 = vpaddw_avx(auVar93,auVar28);
            auVar73 = auVar31;
            if (upsample_left != 0) {
              auVar73 = vpsllw_avx(auVar83,ZEXT416((uint)upsample_left));
              auVar73 = vpsrlw_avx(auVar73,1);
              auVar73 = vpand_avx(auVar73,auVar39);
            }
            auVar64 = vpsraw_avx(auVar83,ZEXT416(6U - upsample_left));
            auVar83 = vpcmpgtw_avx(auVar49,auVar64);
            auVar83 = vpandn_avx(auVar83,auVar64);
            uVar14 = vpextrw_avx(auVar83,1);
            uVar8 = vpextrw_avx(auVar83,2);
            uVar13 = vpextrw_avx(auVar83,3);
            uVar15 = vpextrw_avx(auVar83,4);
            uVar11 = vpextrw_avx(auVar83,5);
            uVar16 = vpextrw_avx(auVar83,6);
            uVar20 = vpextrw_avx(auVar83,7);
            auVar64 = vpinsrw_avx(ZEXT216(left[auVar83._0_2_]),(uint)left[(short)uVar14],1);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar8],2);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar13],3);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar15],4);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar11],5);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar16],6);
            auVar64 = vpinsrw_avx(auVar64,(uint)left[(short)uVar20],7);
            auVar83 = vpinsrw_avx(ZEXT216(left[(long)auVar83._0_2_ + 1]),
                                  (uint)left[(long)(short)uVar14 + 1],1);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar8 + 1],2);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar13 + 1],3);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar15 + 1],4);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar11 + 1],5);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar16 + 1],6);
            auVar83 = vpinsrw_avx(auVar83,(uint)left[(long)(short)uVar20 + 1],7);
            auVar77._0_16_ = ZEXT116(0) * auVar64 + ZEXT116(1) * auVar76._0_16_;
            auVar77._16_16_ = ZEXT116(0) * auVar76._16_16_ + ZEXT116(1) * auVar64;
            auVar86._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar85._0_16_;
            auVar86._16_16_ = ZEXT116(0) * auVar85._16_16_ + ZEXT116(1) * auVar83;
            auVar69._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar68._0_16_;
            auVar69._16_16_ = ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar73;
          }
          auVar52 = vpsubw_avx2(auVar86,auVar77);
          auVar52 = vpmullw_avx2(auVar52,auVar69);
          auVar44 = vpsllw_avx2(auVar77,5);
          auVar52 = vpaddw_avx2(auVar52,auVar44);
          auVar52 = vpaddw_avx2(auVar52,auVar67);
          auVar52 = vpsrlw_avx2(auVar52,5);
          auVar83 = vpblendvb_avx(auVar52._0_16_,auVar52._16_16_,
                                  *(undefined1 (*) [16])HighbdBaseMask[uVar21]);
          *(undefined1 (*) [16])dst = auVar83;
          dst = (uint16_t *)(*(undefined1 (*) [16])dst + stride * 2);
          sVar17 = sVar17 + 0x40;
          uVar9 = uVar9 - dx;
          iVar4 = iVar4 + dx;
          local_7c = local_7c + -1;
        } while (local_7c != 0);
      }
    }
    else if (0 < bh) {
      auVar44._4_4_ = iVar4;
      auVar44._0_4_ = iVar4;
      auVar44._8_4_ = iVar4;
      auVar44._12_4_ = iVar4;
      auVar44._16_4_ = iVar4;
      auVar44._20_4_ = iVar4;
      auVar44._24_4_ = iVar4;
      auVar44._28_4_ = iVar4;
      auVar52._4_4_ = dy;
      auVar52._0_4_ = dy;
      auVar52._8_4_ = dy;
      auVar52._12_4_ = dy;
      auVar52._16_4_ = dy;
      auVar52._20_4_ = dy;
      auVar52._24_4_ = dy;
      auVar52._28_4_ = dy;
      auVar67 = vpmulld_avx2(auVar52,_DAT_00516420);
      auVar52 = vpsrld_avx2(auVar67,1);
      auVar80._8_4_ = 0x1f;
      auVar80._0_8_ = 0x1f0000001f;
      auVar80._12_4_ = 0x1f;
      auVar80._16_4_ = 0x1f;
      auVar80._20_4_ = 0x1f;
      auVar80._24_4_ = 0x1f;
      auVar80._28_4_ = 0x1f;
      auVar52 = vpand_avx2(auVar52,auVar80);
      uVar9 = -dx;
      auVar54._8_4_ = 0x10;
      auVar54._0_8_ = 0x1000000010;
      auVar54._12_4_ = 0x10;
      auVar54._16_4_ = 0x10;
      auVar54._20_4_ = 0x10;
      auVar54._24_4_ = 0x10;
      auVar54._28_4_ = 0x10;
      iVar4 = 0;
      iVar18 = dx;
      do {
        uVar12 = (int)uVar9 >> (6 - bVar7 & 0x1f);
        iVar5 = (int)(~uVar12 + iVar19) >> (bVar7 & 0x1f);
        if (iVar19 + -1 <= (int)uVar12) {
          iVar5 = 0;
        }
        uVar21 = (int)((iVar19 + upsample_above) - uVar12) >> (bVar7 & 0x1f);
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        if (7 < (int)uVar21) {
          uVar21 = 8;
        }
        auVar31 = (undefined1  [16])0x0;
        if (iVar5 < 8) {
          lVar10 = (long)iVar5;
          auVar31 = *(undefined1 (*) [16])(above + (int)uVar12 + lVar10);
          if (upsample_above == 0) {
            auVar31 = vpshufb_avx(auVar31,(undefined1  [16])HighbdLoadMaskx[lVar10]);
            auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[lVar10]);
            auVar83._4_4_ = iVar18;
            auVar83._0_4_ = iVar18;
            auVar83._8_4_ = iVar18;
            auVar83._12_4_ = iVar18;
            iVar5 = uVar9 + 0x140;
            iVar1 = uVar9 + 0x180;
            iVar2 = uVar9 + 0x1c0;
            auVar49 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar49 = vpsubd_avx(auVar49,auVar83);
            auVar94 = vpermq_avx2(ZEXT1632(auVar49),0xc4);
            auVar94 = vpblendd_avx2(auVar94,ZEXT432(uVar9),1);
            auVar47._4_4_ = iVar5;
            auVar47._0_4_ = iVar5;
            auVar47._8_4_ = iVar5;
            auVar47._12_4_ = iVar5;
            auVar47._16_4_ = iVar5;
            auVar47._20_4_ = iVar5;
            auVar47._24_4_ = iVar5;
            auVar47._28_4_ = iVar5;
            auVar94 = vpblendd_avx2(auVar94,auVar47,0x20);
            auVar46._4_4_ = iVar1;
            auVar46._0_4_ = iVar1;
            auVar46._8_4_ = iVar1;
            auVar46._12_4_ = iVar1;
            auVar46._16_4_ = iVar1;
            auVar46._20_4_ = iVar1;
            auVar46._24_4_ = iVar1;
            auVar46._28_4_ = iVar1;
            auVar94 = vpblendd_avx2(auVar94,auVar46,0x40);
            auVar60._4_4_ = iVar2;
            auVar60._0_4_ = iVar2;
            auVar60._8_4_ = iVar2;
            auVar60._12_4_ = iVar2;
            auVar60._16_4_ = iVar2;
            auVar60._20_4_ = iVar2;
            auVar60._24_4_ = iVar2;
            auVar60._28_4_ = iVar2;
            auVar94 = vpblendd_avx2(auVar94,auVar60,0x80);
          }
          else {
            auVar28 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar10];
            auVar49 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar10] + 0x10);
            auVar83 = vpshufb_avx(auVar31,auVar28);
            auVar73 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 8),
                                  auVar28);
            auVar64[8] = 0xf;
            auVar64._0_8_ = 0xf0f0f0f0f0f0f0f;
            auVar64[9] = 0xf;
            auVar64[10] = 0xf;
            auVar64[0xb] = 0xf;
            auVar64[0xc] = 0xf;
            auVar64[0xd] = 0xf;
            auVar64[0xe] = 0xf;
            auVar64[0xf] = 0xf;
            auVar39 = vpshufb_avx(auVar31,auVar49);
            auVar31 = vpcmpgtb_avx(auVar28,auVar64);
            auVar31 = vpblendvb_avx(auVar83,auVar73,auVar31);
            auVar83 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + lVar10 + 8),
                                  auVar49);
            auVar28 = vpcmpgtb_avx(auVar49,auVar64);
            auVar28 = vpblendvb_avx(auVar39,auVar83,auVar28);
            auVar73._4_4_ = iVar18;
            auVar73._0_4_ = iVar18;
            auVar73._8_4_ = iVar18;
            auVar73._12_4_ = iVar18;
            iVar5 = uVar9 + 0x140;
            iVar1 = uVar9 + 0x180;
            iVar2 = uVar9 + 0x1c0;
            auVar49 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar49 = vpsubd_avx(auVar49,auVar73);
            auVar94 = vpermq_avx2(ZEXT1632(auVar49),0xc4);
            auVar94 = vpblendd_avx2(auVar94,ZEXT432(uVar9),1);
            auVar57._4_4_ = iVar5;
            auVar57._0_4_ = iVar5;
            auVar57._8_4_ = iVar5;
            auVar57._12_4_ = iVar5;
            auVar57._16_4_ = iVar5;
            auVar57._20_4_ = iVar5;
            auVar57._24_4_ = iVar5;
            auVar57._28_4_ = iVar5;
            auVar94 = vpblendd_avx2(auVar94,auVar57,0x20);
            auVar58._4_4_ = iVar1;
            auVar58._0_4_ = iVar1;
            auVar58._8_4_ = iVar1;
            auVar58._12_4_ = iVar1;
            auVar58._16_4_ = iVar1;
            auVar58._20_4_ = iVar1;
            auVar58._24_4_ = iVar1;
            auVar58._28_4_ = iVar1;
            auVar94 = vpblendd_avx2(auVar94,auVar58,0x40);
            auVar59._4_4_ = iVar2;
            auVar59._0_4_ = iVar2;
            auVar59._8_4_ = iVar2;
            auVar59._12_4_ = iVar2;
            auVar59._16_4_ = iVar2;
            auVar59._20_4_ = iVar2;
            auVar59._24_4_ = iVar2;
            auVar59._28_4_ = iVar2;
            auVar94 = vpblendd_avx2(auVar94,auVar59,0x80);
            auVar94 = vpslld_avx2(auVar94,ZEXT416((uint)upsample_above));
          }
          auVar46 = vpsrld_avx2(auVar94,1);
          auVar94 = vpmovzxwd_avx2(auVar31);
          auVar47 = vpmovzxwd_avx2(auVar28);
          auVar47 = vpsubd_avx2(auVar47,auVar94);
          auVar60 = vpslld_avx2(auVar94,5);
          auVar94 = vpand_avx2(auVar46,auVar80);
          auVar47 = vpmulld_avx2(auVar47,auVar94);
          auVar94 = vpaddd_avx2(auVar60,auVar54);
          auVar94 = vpaddd_avx2(auVar47,auVar94);
          auVar94 = vpsrld_avx2(auVar94,5);
          auVar31 = vpackusdw_avx(auVar94._0_16_,auVar94._16_16_);
        }
        auVar28 = auVar31;
        if ((int)uVar12 < iVar19) {
          auVar94._4_4_ = iVar4;
          auVar94._0_4_ = iVar4;
          auVar94._8_4_ = iVar4;
          auVar94._12_4_ = iVar4;
          auVar94._16_4_ = iVar4;
          auVar94._20_4_ = iVar4;
          auVar94._24_4_ = iVar4;
          auVar94._28_4_ = iVar4;
          auVar94 = vpaddd_avx2(auVar94,auVar67);
          auVar47 = auVar52;
          if (upsample_left != 0) {
            auVar47 = vpslld_avx2(auVar94,ZEXT416((uint)upsample_left));
            auVar47 = vpsrld_avx2(auVar47,1);
            auVar47 = vpand_avx2(auVar47,auVar80);
          }
          auVar46 = vpsrad_avx2(auVar94,ZEXT416(6U - upsample_left));
          auVar94 = vpcmpgtd_avx2(auVar44,auVar46);
          auVar94 = vpandn_avx2(auVar94,auVar46);
          auVar28 = vpinsrw_avx(ZEXT216(left[auVar94._0_4_]),(uint)left[auVar94._4_4_],1);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._8_4_],2);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._12_4_],3);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._16_4_],4);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._20_4_],5);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._24_4_],6);
          auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._28_4_],7);
          auVar49 = vpinsrw_avx(ZEXT216(left[(long)auVar94._0_4_ + 1]),
                                (uint)left[(long)auVar94._4_4_ + 1],1);
          auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._8_4_ + 1],2);
          auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._12_4_ + 1],3);
          auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._16_4_ + 1],4);
          auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._20_4_ + 1],5);
          auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._24_4_ + 1],6);
          auVar46 = vpmovzxwd_avx2(auVar28);
          auVar28 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._28_4_ + 1],7);
          auVar94 = vpmovzxwd_avx2(auVar28);
          auVar94 = vpsubd_avx2(auVar94,auVar46);
          auVar47 = vpmulld_avx2(auVar47,auVar94);
          auVar94 = vpslld_avx2(auVar46,5);
          auVar94 = vpaddd_avx2(auVar94,auVar54);
          auVar94 = vpaddd_avx2(auVar47,auVar94);
          auVar94 = vpsrld_avx2(auVar94,5);
          auVar28 = vpackusdw_avx(auVar94._0_16_,auVar94._16_16_);
        }
        auVar31 = vpblendvb_avx(auVar31,auVar28,*(undefined1 (*) [16])HighbdBaseMask[uVar21]);
        *(undefined1 (*) [16])dst = auVar31;
        dst = (uint16_t *)(*(undefined1 (*) [16])dst + stride * 2);
        iVar4 = iVar4 + 0x40;
        uVar9 = uVar9 - dx;
        iVar18 = iVar18 + dx;
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  else if (bw == 4) {
    iVar19 = -1 << (bVar7 & 0x1f);
    iVar4 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      if (0 < bh) {
        auVar22._0_2_ = (undefined2)iVar4;
        auVar22._2_2_ = auVar22._0_2_;
        auVar22._4_2_ = auVar22._0_2_;
        auVar22._6_2_ = auVar22._0_2_;
        auVar22._8_2_ = auVar22._0_2_;
        auVar22._10_2_ = auVar22._0_2_;
        auVar22._12_2_ = auVar22._0_2_;
        auVar22._14_2_ = auVar22._0_2_;
        auVar31._2_2_ = auVar31._0_2_;
        auVar31._4_2_ = auVar31._0_2_;
        auVar31._6_2_ = auVar31._0_2_;
        auVar31._8_2_ = auVar31._0_2_;
        auVar31._10_2_ = auVar31._0_2_;
        auVar31._12_2_ = auVar31._0_2_;
        auVar31._14_2_ = auVar31._0_2_;
        auVar28 = vpmullw_avx(auVar31,_DAT_00514f20);
        auVar31 = vpsrlw_avx(auVar28,1);
        auVar31 = vpand_avx(auVar31,_DAT_00514f00);
        uVar9 = -dx;
        auVar38._8_8_ = 0x1f001f001f001f;
        auVar38._0_8_ = 0x1f001f001f001f;
        auVar42._8_2_ = 0x10;
        auVar42._0_8_ = 0x10001000100010;
        auVar42._10_2_ = 0x10;
        auVar42._12_2_ = 0x10;
        auVar42._14_2_ = 0x10;
        auVar42._16_2_ = 0x10;
        auVar42._18_2_ = 0x10;
        auVar42._20_2_ = 0x10;
        auVar42._22_2_ = 0x10;
        auVar42._24_2_ = 0x10;
        auVar42._26_2_ = 0x10;
        auVar42._28_2_ = 0x10;
        auVar42._30_2_ = 0x10;
        sVar17 = 0;
        do {
          uVar12 = (int)uVar9 >> (6 - bVar7 & 0x1f);
          iVar4 = (int)(~uVar12 + iVar19) >> (bVar7 & 0x1f);
          if (iVar19 + -1 <= (int)uVar12) {
            iVar4 = 0;
          }
          uVar21 = (int)((iVar19 + upsample_above) - uVar12) >> (bVar7 & 0x1f);
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if (3 < (int)uVar21) {
            uVar21 = 4;
          }
          auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar74 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar65 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (iVar4 < 4) {
            auVar49 = vpinsrw_avx(ZEXT416(uVar9 & 0xffff),uVar9 + 0x40,1);
            auVar49 = vpinsrw_avx(auVar49,uVar9 + 0x80,2);
            auVar49 = vpinsrw_avx(auVar49,uVar9 + 0xc0,3);
            if (upsample_above == 0) {
              auVar83 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + (long)iVar4),
                                    (undefined1  [16])HighbdLoadMaskx[iVar4]);
              auVar73 = vpsrldq_avx(auVar83,2);
            }
            else {
              auVar83 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + (long)iVar4),
                                    (undefined1  [16])HighbdEvenOddMaskx4[iVar4]);
              auVar73 = vpsrldq_avx(auVar83,8);
              auVar49 = vpsllw_avx(auVar49,ZEXT416((uint)upsample_above));
            }
            auVar49 = vpsrlw_avx(auVar49,1);
            auVar49 = vpand_avx(auVar49,auVar38);
            auVar50._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar49;
            auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
            auVar65._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar83;
            auVar65._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
            auVar74._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar73;
            auVar74._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
          }
          auVar75 = auVar74;
          auVar51 = auVar50;
          auVar66 = auVar65;
          if ((int)uVar12 < iVar19) {
            auVar82._2_2_ = sVar17;
            auVar82._0_2_ = sVar17;
            auVar82._4_2_ = sVar17;
            auVar82._6_2_ = sVar17;
            auVar82._8_2_ = sVar17;
            auVar82._10_2_ = sVar17;
            auVar82._12_2_ = sVar17;
            auVar82._14_2_ = sVar17;
            auVar49 = vpaddw_avx(auVar82,auVar28);
            auVar83 = auVar31;
            if (upsample_left != 0) {
              auVar83 = vpsllw_avx(auVar49,ZEXT416((uint)upsample_left));
              auVar83 = vpsrlw_avx(auVar83,1);
              auVar83 = vpand_avx(auVar83,auVar38);
            }
            auVar73 = vpsraw_avx(auVar49,ZEXT416(6U - upsample_left));
            auVar49 = vpcmpgtw_avx(auVar22,auVar73);
            auVar49 = vpandn_avx(auVar49,auVar73);
            uVar8 = vpextrw_avx(auVar49,1);
            uVar13 = vpextrw_avx(auVar49,2);
            uVar16 = vpextrw_avx(auVar49,3);
            auVar73 = vpinsrw_avx(ZEXT216(left[auVar49._0_2_]),(uint)left[(short)uVar8],1);
            auVar73 = vpinsrw_avx(auVar73,(uint)left[(short)uVar13],2);
            auVar73 = vpinsrw_avx(auVar73,(uint)left[(short)uVar16],3);
            auVar49 = vpinsrw_avx(ZEXT216(left[(long)auVar49._0_2_ + 1]),
                                  (uint)left[(long)(short)uVar8 + 1],1);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)(short)uVar13 + 1],2);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)(short)uVar16 + 1],3);
            auVar66._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar65._0_16_;
            auVar66._16_16_ = ZEXT116(0) * auVar65._16_16_ + ZEXT116(1) * auVar73;
            auVar75._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar74._0_16_;
            auVar75._16_16_ = ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar49;
            auVar51._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar50._0_16_;
            auVar51._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar83;
          }
          auVar52 = vpsubw_avx2(auVar75,auVar66);
          auVar52 = vpmullw_avx2(auVar52,auVar51);
          auVar67 = vpsllw_avx2(auVar66,5);
          auVar52 = vpaddw_avx2(auVar67,auVar52);
          auVar52 = vpaddw_avx2(auVar52,auVar42);
          auVar52 = vpsrlw_avx2(auVar52,5);
          auVar49 = vpblendvb_avx(auVar52._0_16_,auVar52._16_16_,
                                  *(undefined1 (*) [16])HighbdBaseMask[uVar21]);
          *(long *)dst = auVar49._0_8_;
          dst = dst + stride;
          sVar17 = sVar17 + 0x40;
          uVar9 = uVar9 - dx;
          local_7c = local_7c + -1;
        } while (local_7c != 0);
      }
    }
    else if (0 < bh) {
      auVar24._4_4_ = iVar4;
      auVar24._0_4_ = iVar4;
      auVar24._8_4_ = iVar4;
      auVar24._12_4_ = iVar4;
      auVar29._4_4_ = dy;
      auVar29._0_4_ = dy;
      auVar29._8_4_ = dy;
      auVar29._12_4_ = dy;
      auVar28 = vpmulld_avx(auVar29,_DAT_00516550);
      auVar31 = vpsrld_avx(auVar28,1);
      auVar34._8_4_ = 0x1f;
      auVar34._0_8_ = 0x1f0000001f;
      auVar34._12_4_ = 0x1f;
      auVar31 = vpand_avx(auVar31,auVar34);
      uVar9 = -dx;
      auVar40._8_8_ = 0x1f0000001f;
      auVar40._0_8_ = 0x1f0000001f;
      auVar45._8_4_ = 0x10;
      auVar45._0_8_ = 0x1000000010;
      auVar45._12_4_ = 0x10;
      auVar45._16_4_ = 0x10;
      auVar45._20_4_ = 0x10;
      auVar45._24_4_ = 0x10;
      auVar45._28_4_ = 0x10;
      iVar4 = 0;
      do {
        uVar12 = (int)uVar9 >> (6 - bVar7 & 0x1f);
        iVar18 = (int)(~uVar12 + iVar19) >> (bVar7 & 0x1f);
        if (iVar19 + -1 <= (int)uVar12) {
          iVar18 = 0;
        }
        uVar21 = (int)((iVar19 + upsample_above) - uVar12) >> (bVar7 & 0x1f);
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        if (3 < (int)uVar21) {
          uVar21 = 4;
        }
        auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar67 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar52 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (iVar18 < 4) {
          auVar49 = vpinsrd_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
          auVar49 = vpinsrd_avx(auVar49,uVar9 + 0x80,2);
          auVar49 = vpinsrd_avx(auVar49,uVar9 + 0xc0,3);
          if (upsample_above == 0) {
            auVar83 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + (long)iVar18),
                                  (undefined1  [16])HighbdLoadMaskx[iVar18]);
            auVar73 = vpsrldq_avx(auVar83,2);
          }
          else {
            auVar83 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + (long)iVar18),
                                  (undefined1  [16])HighbdEvenOddMaskx4[iVar18]);
            auVar73 = vpsrldq_avx(auVar83,8);
            auVar49 = vpslld_avx(auVar49,ZEXT416((uint)upsample_above));
          }
          auVar49 = vpsrld_avx(auVar49,1);
          auVar49 = vpand_avx(auVar49,auVar40);
          auVar55._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar49;
          auVar55._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
          auVar52 = vpmovzxwd_avx2(auVar83);
          auVar67 = vpmovzxwd_avx2(auVar73);
        }
        auVar81 = auVar67;
        auVar56 = auVar55;
        auVar71 = auVar52;
        if ((int)uVar12 < iVar19) {
          auVar84._4_4_ = iVar4;
          auVar84._0_4_ = iVar4;
          auVar84._8_4_ = iVar4;
          auVar84._12_4_ = iVar4;
          auVar49 = vpaddd_avx(auVar84,auVar28);
          auVar83 = auVar31;
          if (upsample_left != 0) {
            auVar83 = vpslld_avx(auVar49,ZEXT416((uint)upsample_left));
            auVar83 = vpsrld_avx(auVar83,1);
            auVar83 = vpand_avx(auVar83,auVar40);
          }
          auVar73 = vpsrad_avx(auVar49,ZEXT416(6U - upsample_left));
          auVar49 = vpcmpgtd_avx(auVar24,auVar73);
          auVar49 = vpandn_avx(auVar49,auVar73);
          auVar73 = vpinsrd_avx(ZEXT216(left[auVar49._0_4_]),(uint)left[auVar49._4_4_],1);
          auVar73 = vpinsrd_avx(auVar73,(uint)left[auVar49._8_4_],2);
          auVar73 = vpinsrd_avx(auVar73,(uint)left[auVar49._12_4_],3);
          auVar39 = vpinsrd_avx(ZEXT216(left[(long)auVar49._0_4_ + 1]),
                                (uint)left[(long)auVar49._4_4_ + 1],1);
          auVar39 = vpinsrd_avx(auVar39,(uint)left[(long)auVar49._8_4_ + 1],2);
          auVar49 = vpinsrd_avx(auVar39,(uint)left[(long)auVar49._12_4_ + 1],3);
          auVar71._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar52._0_16_;
          auVar71._16_16_ = ZEXT116(0) * auVar52._16_16_ + ZEXT116(1) * auVar73;
          auVar81._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar67._0_16_;
          auVar81._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar49;
          auVar56._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar55._0_16_;
          auVar56._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar83;
        }
        auVar52 = vpsubd_avx2(auVar81,auVar71);
        auVar52 = vpmulld_avx2(auVar52,auVar56);
        auVar67 = vpslld_avx2(auVar71,5);
        auVar52 = vpaddd_avx2(auVar67,auVar52);
        auVar52 = vpaddd_avx2(auVar52,auVar45);
        auVar52 = vpsrld_avx2(auVar52,5);
        auVar49 = vpackusdw_avx(auVar52._0_16_,auVar52._0_16_);
        auVar83 = vpackusdw_avx(auVar52._16_16_,auVar52._16_16_);
        auVar49 = vpblendvb_avx(auVar49,auVar83,*(undefined1 (*) [16])HighbdBaseMask[uVar21]);
        *(long *)dst = auVar49._0_8_;
        dst = dst + stride;
        iVar4 = iVar4 + 0x40;
        uVar9 = uVar9 - dx;
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  else if (bd < 0xc) {
    if (0 < bh) {
      auVar23._2_2_ = auVar31._0_2_;
      auVar23._0_2_ = auVar31._0_2_;
      auVar23._4_2_ = auVar31._0_2_;
      auVar23._6_2_ = auVar31._0_2_;
      auVar23._8_2_ = auVar31._0_2_;
      auVar23._10_2_ = auVar31._0_2_;
      auVar23._12_2_ = auVar31._0_2_;
      auVar23._14_2_ = auVar31._0_2_;
      auVar26._16_2_ = auVar31._0_2_;
      auVar26._0_16_ = auVar23;
      auVar26._18_2_ = auVar31._0_2_;
      auVar26._20_2_ = auVar31._0_2_;
      auVar26._22_2_ = auVar31._0_2_;
      auVar26._24_2_ = auVar31._0_2_;
      auVar26._26_2_ = auVar31._0_2_;
      auVar26._28_2_ = auVar31._0_2_;
      auVar26._30_2_ = auVar31._0_2_;
      iVar4 = -dx;
      auVar30._8_2_ = 0x10;
      auVar30._0_8_ = 0x10001000100010;
      auVar30._10_2_ = 0x10;
      auVar30._12_2_ = 0x10;
      auVar30._14_2_ = 0x10;
      auVar30._16_2_ = 0x10;
      auVar30._18_2_ = 0x10;
      auVar30._20_2_ = 0x10;
      auVar30._22_2_ = 0x10;
      auVar30._24_2_ = 0x10;
      auVar30._26_2_ = 0x10;
      auVar30._28_2_ = 0x10;
      auVar30._30_2_ = 0x10;
      auVar32._8_2_ = 0x7fff;
      auVar32._0_8_ = 0x7fff7fff7fff7fff;
      auVar32._10_2_ = 0x7fff;
      auVar32._12_2_ = 0x7fff;
      auVar32._14_2_ = 0x7fff;
      auVar32._16_2_ = 0x7fff;
      auVar32._18_2_ = 0x7fff;
      auVar32._20_2_ = 0x7fff;
      auVar32._22_2_ = 0x7fff;
      auVar32._24_2_ = 0x7fff;
      auVar32._26_2_ = 0x7fff;
      auVar32._28_2_ = 0x7fff;
      auVar32._30_2_ = 0x7fff;
      auVar67 = vpmovsxbw_avx2(_DAT_00516560);
      auVar52 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
      iVar19 = 0;
      do {
        iVar18 = iVar19 + 1;
        if (0 < bw) {
          uVar3 = (ushort)((uint)-(iVar18 * dx) >> 1);
          uVar37 = uVar3 & 0x1f;
          auVar41._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
          auVar41._8_2_ = uVar37;
          auVar41._10_2_ = uVar37;
          auVar41._12_2_ = uVar37;
          auVar41._14_2_ = uVar37;
          auVar41._16_2_ = uVar37;
          auVar41._18_2_ = uVar37;
          auVar41._20_2_ = uVar37;
          auVar41._22_2_ = uVar37;
          auVar41._24_2_ = uVar37;
          auVar41._26_2_ = uVar37;
          auVar41._28_2_ = uVar37;
          auVar41._30_2_ = uVar37;
          auVar43._0_2_ = (undefined2)iVar19;
          auVar43._2_2_ = auVar43._0_2_;
          auVar43._4_2_ = auVar43._0_2_;
          auVar43._6_2_ = auVar43._0_2_;
          auVar43._8_2_ = auVar43._0_2_;
          auVar43._10_2_ = auVar43._0_2_;
          auVar43._12_2_ = auVar43._0_2_;
          auVar43._14_2_ = auVar43._0_2_;
          auVar43._16_2_ = auVar43._0_2_;
          auVar43._18_2_ = auVar43._0_2_;
          auVar43._20_2_ = auVar43._0_2_;
          auVar43._22_2_ = auVar43._0_2_;
          auVar43._24_2_ = auVar43._0_2_;
          auVar43._26_2_ = auVar43._0_2_;
          auVar43._28_2_ = auVar43._0_2_;
          auVar43._30_2_ = auVar43._0_2_;
          auVar44 = vpsllw_avx2(auVar43,6);
          lVar10 = 0;
          iVar19 = iVar4;
          do {
            uVar12 = iVar19 >> 6;
            uVar9 = -(uVar12 + 2);
            if (-3 < (int)uVar12) {
              uVar9 = 0;
            }
            uVar21 = 0xffffffff;
            if ((int)uVar12 < -1) {
              uVar21 = uVar12;
            }
            uVar21 = ~uVar21;
            if ((int)uVar12 < -0x11) {
              uVar21 = 0x10;
            }
            if ((int)uVar9 < 8) {
              uVar6 = (ulong)uVar9;
              auVar31 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6),
                                    (undefined1  [16])HighbdLoadMaskx[uVar6]);
              auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 1),
                                    (undefined1  [16])HighbdLoadMaskx[uVar6]);
              auVar53._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar31;
              auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23
              ;
              auVar78._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar28;
              auVar78._16_16_ = ZEXT116(1) * auVar23;
              uVar6 = 0;
LAB_003568a3:
              auVar31 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 8),
                                    (undefined1  [16])HighbdLoadMaskx[uVar6]);
              auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 9),
                                    (undefined1  [16])HighbdLoadMaskx[uVar6]);
              auVar70._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar53._0_16_;
              auVar70._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar31;
              auVar53._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar78._0_16_;
              auVar53._16_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar28;
            }
            else {
              auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar70 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              if (uVar9 - 8 < 8) {
                uVar6 = (ulong)(uVar9 - 8);
                auVar78 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                goto LAB_003568a3;
              }
            }
            auVar80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            if ((int)uVar12 < -1) {
              auVar79._0_2_ = (undefined2)lVar10;
              auVar79._2_2_ = auVar79._0_2_;
              auVar79._4_2_ = auVar79._0_2_;
              auVar79._6_2_ = auVar79._0_2_;
              auVar79._8_2_ = auVar79._0_2_;
              auVar79._10_2_ = auVar79._0_2_;
              auVar79._12_2_ = auVar79._0_2_;
              auVar79._14_2_ = auVar79._0_2_;
              auVar79._16_2_ = auVar79._0_2_;
              auVar79._18_2_ = auVar79._0_2_;
              auVar79._20_2_ = auVar79._0_2_;
              auVar79._22_2_ = auVar79._0_2_;
              auVar79._24_2_ = auVar79._0_2_;
              auVar79._26_2_ = auVar79._0_2_;
              auVar79._28_2_ = auVar79._0_2_;
              auVar79._30_2_ = auVar79._0_2_;
              auVar80 = vpaddw_avx2(auVar79,auVar67);
              auVar80 = vpmullw_avx2(auVar80,auVar26);
              auVar80 = vpminuw_avx2(auVar80,auVar32);
              auVar54 = vpsubw_avx2(auVar44,auVar80);
              auVar87._8_2_ = 0xfffe;
              auVar87._0_8_ = 0xfffefffefffefffe;
              auVar87._10_2_ = 0xfffe;
              auVar87._12_2_ = 0xfffe;
              auVar87._14_2_ = 0xfffe;
              auVar87._16_2_ = 0xfffe;
              auVar87._18_2_ = 0xfffe;
              auVar87._20_2_ = 0xfffe;
              auVar87._22_2_ = 0xfffe;
              auVar87._24_2_ = 0xfffe;
              auVar87._26_2_ = 0xfffe;
              auVar87._28_2_ = 0xfffe;
              auVar87._30_2_ = 0xfffe;
              auVar94 = vpsraw_avx2(auVar54,6);
              auVar80 = vpcmpgtw_avx2(auVar94,auVar87);
              auVar80 = vpand_avx2(auVar80,auVar94);
              auVar49 = auVar80._0_16_;
              auVar28 = auVar80._16_16_;
              uVar8 = vpextrw_avx(auVar28,1);
              uVar13 = vpextrw_avx(auVar28,2);
              auVar31 = vpinsrw_avx(ZEXT216(left[auVar80._16_2_]),(uint)left[(short)uVar8],1);
              uVar8 = vpextrw_avx(auVar28,3);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar13],2);
              uVar13 = vpextrw_avx(auVar28,4);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar8],3);
              uVar8 = vpextrw_avx(auVar28,5);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar13],4);
              uVar13 = vpextrw_avx(auVar28,6);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar8],5);
              uVar8 = vpextrw_avx(auVar28,7);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar13],6);
              auVar31 = vpinsrw_avx(auVar31,(uint)left[(short)uVar8],7);
              uVar13 = vpextrw_avx(auVar49,1);
              uVar8 = vpextrw_avx(auVar49,2);
              auVar28 = vpinsrw_avx(ZEXT216(left[auVar80._0_2_]),(uint)left[(short)uVar13],1);
              uVar13 = vpextrw_avx(auVar49,3);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar8],2);
              uVar8 = vpextrw_avx(auVar49,4);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar13],3);
              uVar13 = vpextrw_avx(auVar49,5);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar8],4);
              uVar8 = vpextrw_avx(auVar49,6);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar13],5);
              uVar13 = vpextrw_avx(auVar49,7);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar8],6);
              auVar28 = vpinsrw_avx(auVar28,(uint)left[(short)uVar13],7);
              auVar80 = vpsubw_avx2(auVar80,auVar52);
              auVar73 = auVar80._0_16_;
              auVar83 = auVar80._16_16_;
              uVar8 = vpextrw_avx(auVar83,1);
              uVar13 = vpextrw_avx(auVar83,2);
              auVar49 = vpinsrw_avx(ZEXT216(left[auVar80._16_2_]),(uint)left[(short)uVar8],1);
              uVar8 = vpextrw_avx(auVar83,3);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar13],2);
              uVar13 = vpextrw_avx(auVar83,4);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar8],3);
              uVar8 = vpextrw_avx(auVar83,5);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar13],4);
              uVar13 = vpextrw_avx(auVar83,6);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar8],5);
              uVar8 = vpextrw_avx(auVar83,7);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar13],6);
              auVar49 = vpinsrw_avx(auVar49,(uint)left[(short)uVar8],7);
              uVar8 = vpextrw_avx(auVar73,1);
              auVar83 = vpinsrw_avx(ZEXT216(left[auVar80._0_2_]),(uint)left[(short)uVar8],1);
              uVar8 = vpextrw_avx(auVar73,2);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],2);
              uVar8 = vpextrw_avx(auVar73,3);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],3);
              uVar8 = vpextrw_avx(auVar73,4);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],4);
              uVar8 = vpextrw_avx(auVar73,5);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],5);
              uVar8 = vpextrw_avx(auVar73,6);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],6);
              uVar8 = vpextrw_avx(auVar73,7);
              auVar83 = vpinsrw_avx(auVar83,(uint)left[(short)uVar8],7);
              auVar88._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar28;
              auVar88._16_16_ = ZEXT116(1) * auVar31;
              auVar95._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar83;
              auVar95._16_16_ = ZEXT116(1) * auVar49;
              auVar96._8_2_ = 0x1f;
              auVar96._0_8_ = 0x1f001f001f001f;
              auVar96._10_2_ = 0x1f;
              auVar96._12_2_ = 0x1f;
              auVar96._14_2_ = 0x1f;
              auVar96._16_2_ = 0x1f;
              auVar96._18_2_ = 0x1f;
              auVar96._20_2_ = 0x1f;
              auVar96._22_2_ = 0x1f;
              auVar96._24_2_ = 0x1f;
              auVar96._26_2_ = 0x1f;
              auVar96._28_2_ = 0x1f;
              auVar96._30_2_ = 0x1f;
              auVar80 = vpsrlw_avx2(auVar54,1);
              auVar80 = vpand_avx2(auVar80,auVar96);
              auVar54 = vpsubw_avx2(auVar95,auVar88);
              auVar54 = vpmullw_avx2(auVar54,auVar80);
              auVar80 = vpsllw_avx2(auVar88,5);
              auVar80 = vpaddw_avx2(auVar80,auVar30);
              auVar80 = vpaddw_avx2(auVar54,auVar80);
              auVar80 = vpsrlw_avx2(auVar80,5);
            }
            auVar54 = vpsubw_avx2(auVar53,auVar70);
            auVar54 = vpmullw_avx2(auVar54,auVar41);
            auVar94 = vpsllw_avx2(auVar70,5);
            auVar54 = vpaddw_avx2(auVar94,auVar54);
            auVar54 = vpaddw_avx2(auVar54,auVar30);
            auVar54 = vpsrlw_avx2(auVar54,5);
            auVar80 = vpblendvb_avx2(auVar54,auVar80,(undefined1  [32])HighbdBaseMask[uVar21]);
            *(undefined1 (*) [32])(dst + lVar10) = auVar80;
            lVar10 = lVar10 + 0x10;
            iVar19 = iVar19 + 0x400;
          } while (lVar10 < bw);
        }
        dst = dst + stride;
        iVar4 = iVar4 - dx;
        iVar19 = iVar18;
      } while (iVar18 != bh);
    }
  }
  else if (0 < bh) {
    auVar25._4_4_ = dy;
    auVar25._0_4_ = dy;
    auVar25._8_4_ = dy;
    auVar25._12_4_ = dy;
    auVar27._16_4_ = dy;
    auVar27._0_16_ = auVar25;
    auVar27._20_4_ = dy;
    auVar27._24_4_ = dy;
    auVar27._28_4_ = dy;
    iVar4 = -dx;
    auVar52 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
    auVar33._8_4_ = 0xfffffffe;
    auVar33._0_8_ = 0xfffffffefffffffe;
    auVar33._12_4_ = 0xfffffffe;
    auVar33._16_4_ = 0xfffffffe;
    auVar33._20_4_ = 0xfffffffe;
    auVar33._24_4_ = 0xfffffffe;
    auVar33._28_4_ = 0xfffffffe;
    auVar35._8_4_ = 0x1f;
    auVar35._0_8_ = 0x1f0000001f;
    auVar35._12_4_ = 0x1f;
    auVar35._16_4_ = 0x1f;
    auVar35._20_4_ = 0x1f;
    auVar35._24_4_ = 0x1f;
    auVar35._28_4_ = 0x1f;
    auVar36._8_4_ = 0x10;
    auVar36._0_8_ = 0x1000000010;
    auVar36._12_4_ = 0x10;
    auVar36._16_4_ = 0x10;
    auVar36._20_4_ = 0x10;
    auVar36._24_4_ = 0x10;
    auVar36._28_4_ = 0x10;
    auVar67 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
    iVar19 = 0;
    do {
      iVar18 = iVar19 + 1;
      if (0 < bw) {
        uVar9 = (uint)-(iVar18 * dx) >> 1;
        uVar12 = uVar9 & 0x1f;
        auVar48._0_8_ = CONCAT44(uVar9,uVar9) & 0x1f0000001f;
        auVar48._8_4_ = uVar12;
        auVar48._12_4_ = uVar12;
        auVar48._16_4_ = uVar12;
        auVar48._20_4_ = uVar12;
        auVar48._24_4_ = uVar12;
        auVar48._28_4_ = uVar12;
        iVar19 = iVar19 << 6;
        auVar61._4_4_ = iVar19;
        auVar61._0_4_ = iVar19;
        auVar61._8_4_ = iVar19;
        auVar61._12_4_ = iVar19;
        auVar61._16_4_ = iVar19;
        auVar61._20_4_ = iVar19;
        auVar61._24_4_ = iVar19;
        auVar61._28_4_ = iVar19;
        lVar10 = 0;
        iVar19 = iVar4;
        do {
          uVar12 = iVar19 >> 6;
          uVar9 = -(uVar12 + 2);
          if (-3 < (int)uVar12) {
            uVar9 = 0;
          }
          uVar21 = 0xffffffff;
          if ((int)uVar12 < -1) {
            uVar21 = uVar12;
          }
          uVar21 = ~uVar21;
          if ((int)uVar12 < -0x11) {
            uVar21 = 0x10;
          }
          auVar31 = (undefined1  [16])0x0;
          auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if ((int)uVar9 < 8) {
            uVar6 = (ulong)uVar9;
            auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6),
                                  (undefined1  [16])HighbdLoadMaskx[uVar6]);
            auVar49 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[uVar6]);
            auVar44 = vpmovzxwd_avx2(auVar28);
            auVar80 = vpmovzxwd_avx2(auVar49);
            auVar80 = vpsubd_avx2(auVar80,auVar44);
            auVar44 = vpslld_avx2(auVar44,5);
            auVar80 = vpmulld_avx2(auVar80,auVar48);
            auVar44 = vpaddd_avx2(auVar44,auVar36);
            auVar44 = vpaddd_avx2(auVar80,auVar44);
            auVar44 = vpsrld_avx2(auVar44,5);
            auVar89._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar44._16_16_;
            auVar89._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
            auVar44 = vpackusdw_avx2(auVar44,auVar89);
          }
          uVar9 = -(uVar12 + 10);
          if (-0xb < (int)uVar12) {
            uVar9 = 0;
          }
          if ((int)uVar9 < 8) {
            uVar6 = (ulong)uVar9;
            auVar31 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 8),
                                  (undefined1  [16])HighbdLoadMaskx[uVar6]);
            auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar12 + uVar6 + 9),
                                  (undefined1  [16])HighbdLoadMaskx[uVar6]);
            auVar80 = vpmovzxwd_avx2(auVar31);
            auVar54 = vpmovzxwd_avx2(auVar28);
            auVar54 = vpsubd_avx2(auVar54,auVar80);
            auVar80 = vpslld_avx2(auVar80,5);
            auVar54 = vpmulld_avx2(auVar54,auVar48);
            auVar80 = vpaddd_avx2(auVar80,auVar36);
            auVar80 = vpaddd_avx2(auVar54,auVar80);
            auVar80 = vpsrld_avx2(auVar80,5);
            auVar90._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar80._16_16_;
            auVar90._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
            auVar80 = vpackusdw_avx2(auVar80,auVar90);
            auVar31 = auVar80._0_16_;
          }
          auVar80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if ((int)uVar12 < -1) {
            uVar8 = (undefined4)lVar10;
            auVar91._4_4_ = uVar8;
            auVar91._0_4_ = uVar8;
            auVar91._8_4_ = uVar8;
            auVar91._12_4_ = uVar8;
            auVar91._16_4_ = uVar8;
            auVar91._20_4_ = uVar8;
            auVar91._24_4_ = uVar8;
            auVar91._28_4_ = uVar8;
            auVar80 = vpor_avx2(auVar91,auVar52);
            auVar80 = vpmulld_avx2(auVar80,auVar27);
            auVar46 = vpsubd_avx2(auVar61,auVar80);
            auVar54 = vpsrad_avx2(auVar46,6);
            auVar80 = vpcmpgtd_avx2(auVar54,auVar33);
            auVar54 = vpand_avx2(auVar80,auVar54);
            auVar80 = vpaddd_avx2(auVar91,auVar67);
            auVar80 = vpmulld_avx2(auVar80,auVar27);
            auVar60 = vpsubd_avx2(auVar61,auVar80);
            auVar94 = vpsrad_avx2(auVar60,6);
            auVar80 = vpcmpgtd_avx2(auVar94,auVar33);
            auVar94 = vpand_avx2(auVar80,auVar94);
            auVar28 = vpinsrw_avx(ZEXT216(left[auVar54._0_4_]),(uint)left[auVar54._4_4_],1);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._8_4_],2);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._12_4_],3);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._16_4_],4);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._20_4_],5);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._24_4_],6);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar54._28_4_],7);
            auVar49 = vpinsrw_avx(ZEXT216(left[(long)auVar54._0_4_ + 1]),
                                  (uint)left[(long)auVar54._4_4_ + 1],1);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._8_4_ + 1],2);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._12_4_ + 1],3);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._16_4_ + 1],4);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._20_4_ + 1],5);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._24_4_ + 1],6);
            auVar47 = vpmovzxwd_avx2(auVar28);
            auVar28 = vpinsrw_avx(auVar49,(uint)left[(long)auVar54._28_4_ + 1],7);
            auVar54 = vpmovzxwd_avx2(auVar28);
            auVar80 = vpsrld_avx2(auVar46,1);
            auVar80 = vpand_avx2(auVar80,auVar35);
            auVar54 = vpsubd_avx2(auVar54,auVar47);
            auVar54 = vpmulld_avx2(auVar54,auVar80);
            auVar80 = vpslld_avx2(auVar47,5);
            auVar80 = vpaddd_avx2(auVar80,auVar36);
            auVar80 = vpaddd_avx2(auVar54,auVar80);
            auVar28 = vpinsrw_avx(ZEXT216(left[auVar94._0_4_]),(uint)left[auVar94._4_4_],1);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._8_4_],2);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._12_4_],3);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._16_4_],4);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._20_4_],5);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._24_4_],6);
            auVar28 = vpinsrw_avx(auVar28,(uint)left[auVar94._28_4_],7);
            auVar49 = vpinsrw_avx(ZEXT216(left[(long)auVar94._0_4_ + 1]),
                                  (uint)left[(long)auVar94._4_4_ + 1],1);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._8_4_ + 1],2);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._12_4_ + 1],3);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._16_4_ + 1],4);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._20_4_ + 1],5);
            auVar49 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._24_4_ + 1],6);
            auVar47 = vpmovzxwd_avx2(auVar28);
            auVar28 = vpinsrw_avx(auVar49,(uint)left[(long)auVar94._28_4_ + 1],7);
            auVar94 = vpmovzxwd_avx2(auVar28);
            auVar54 = vpsrld_avx2(auVar60,1);
            auVar54 = vpand_avx2(auVar54,auVar35);
            auVar94 = vpsubd_avx2(auVar94,auVar47);
            auVar94 = vpmulld_avx2(auVar94,auVar54);
            auVar54 = vpslld_avx2(auVar47,5);
            auVar54 = vpaddd_avx2(auVar54,auVar36);
            auVar54 = vpaddd_avx2(auVar94,auVar54);
            auVar94 = vperm2i128_avx2(auVar80,auVar54,0x31);
            auVar94 = vpsrld_avx2(auVar94,5);
            auVar92._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar80._0_16_;
            auVar92._16_16_ = ZEXT116(0) * auVar80._16_16_ + ZEXT116(1) * auVar54._0_16_;
            auVar80 = vpsrld_avx2(auVar92,5);
            auVar80 = vpackusdw_avx2(auVar80,auVar94);
          }
          auVar72._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar44._0_16_;
          auVar72._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar31;
          auVar44 = vpblendvb_avx2(auVar72,auVar80,(undefined1  [32])HighbdBaseMask[uVar21]);
          *(undefined1 (*) [32])(dst + lVar10) = auVar44;
          lVar10 = lVar10 + 0x10;
          iVar19 = iVar19 + 0x400;
        } while (lVar10 < bw);
      }
      dst = dst + stride;
      iVar4 = iVar4 - dx;
      iVar19 = iVar18;
    } while (iVar18 != bh);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int upsample_left, int dx, int dy,
                                      int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx4_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    case 8:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx8_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    default:
      if (bd < 12) {
        highbd_dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
  }
}